

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cupdlp_step.c
# Opt level: O0

cupdlp_retcode PDHG_Power_Method(CUPDLPwork *work,cupdlp_float *lambda)

{
  int *piVar1;
  void *__dest;
  cupdlp_float cVar2;
  ulong *in_RSI;
  undefined8 *in_RDI;
  cupdlp_float alpha;
  cupdlp_float qNorm;
  cupdlp_int iter_1;
  double res;
  CUPDLPvec *aty;
  CUPDLPvec *ax;
  cupdlp_int iter;
  cupdlp_float *q;
  CUPDLPiterates *iterates;
  CUPDLPdata *lp;
  CUPDLPproblem *problem;
  cupdlp_retcode retcode;
  undefined4 in_stack_ffffffffffffff78;
  cupdlp_int in_stack_ffffffffffffff7c;
  cupdlp_float *in_stack_ffffffffffffff80;
  cupdlp_float *x;
  cupdlp_float *weight;
  CUPDLPwork *in_stack_ffffffffffffff90;
  CUPDLPvec *in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  uint uVar3;
  
  piVar1 = *(int **)*in_RDI;
  x = (cupdlp_float *)in_RDI[3];
  if (0 < *(int *)(in_RDI[1] + 0x38)) {
    printf("Power Method:\n");
  }
  __dest = *(void **)(in_RDI[7] + 8);
  cupdlp_initvec(in_stack_ffffffffffffff80,
                 (cupdlp_float)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),0);
  cVar2 = x[(long)(*(int *)in_RDI[6] % 2) + 0xc];
  weight = x;
  for (uVar3 = 0; (int)uVar3 < 0x14; uVar3 = uVar3 + 1) {
    ATy((CUPDLPwork *)CONCAT44(uVar3,in_stack_ffffffffffffffa0),in_stack_ffffffffffffff98,
        (CUPDLPvec *)in_stack_ffffffffffffff90);
    Ax((CUPDLPwork *)CONCAT44(uVar3,in_stack_ffffffffffffffa0),in_stack_ffffffffffffff98,
       (CUPDLPvec *)in_stack_ffffffffffffff90);
    memcpy(__dest,*(void **)((long)cVar2 + 8),(long)*piVar1 << 3);
    in_stack_ffffffffffffff98 = (CUPDLPvec *)0x0;
    cupdlp_twoNorm(in_stack_ffffffffffffff90,(cupdlp_int)((ulong)weight >> 0x20),x,
                   (cupdlp_float *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    cupdlp_scaleVector(in_stack_ffffffffffffff90,(cupdlp_float)weight,x,in_stack_ffffffffffffff7c);
    ATy((CUPDLPwork *)CONCAT44(uVar3,in_stack_ffffffffffffffa0),in_stack_ffffffffffffff98,
        (CUPDLPvec *)in_stack_ffffffffffffff90);
    cupdlp_twoNormSquared
              (in_stack_ffffffffffffff90,(cupdlp_int)((ulong)weight >> 0x20),x,
               (cupdlp_float *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    in_stack_ffffffffffffff90 = (CUPDLPwork *)(*in_RSI ^ 0x8000000000000000);
    cupdlp_axpy(in_stack_ffffffffffffff90,(cupdlp_int)((ulong)weight >> 0x20),x,
                (cupdlp_float *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                (cupdlp_float *)0x801786);
    cupdlp_twoNormSquared
              (in_stack_ffffffffffffff90,(cupdlp_int)((ulong)weight >> 0x20),x,
               (cupdlp_float *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    if (0 < *(int *)(in_RDI[1] + 0x38)) {
      printf("% d  %e  %.3f\n",*in_RSI,0,(ulong)uVar3);
    }
  }
  return 0;
}

Assistant:

cupdlp_retcode PDHG_Power_Method(CUPDLPwork *work, cupdlp_float *lambda) {
  cupdlp_retcode retcode = RETCODE_OK;
  CUPDLPproblem *problem = work->problem;
  CUPDLPdata *lp = problem->data;
  CUPDLPiterates *iterates = work->iterates;

  if (work->settings->nLogLevel>0) 
    cupdlp_printf("Power Method:\n");

  cupdlp_float *q = work->buffer->data;

  cupdlp_initvec(q, 1.0, lp->nRows);

  cupdlp_int iter = work->timers->nIter;
  CUPDLPvec *ax = iterates->ax[iter % 2];
  CUPDLPvec *aty = iterates->aty[iter % 2];

  double res = 0.0;
  for (cupdlp_int iter = 0; iter < 20; ++iter) {
    // z = A*A'*q
    ATy(work, aty, work->buffer);
    Ax(work, ax, aty);

    // q = z / norm(z)
    CUPDLP_COPY_VEC(q, ax->data, cupdlp_float, lp->nRows);
    cupdlp_float qNorm = 0.0;
    cupdlp_twoNorm(work, lp->nRows, q, &qNorm);
    cupdlp_scaleVector(work, 1.0 / qNorm, q, lp->nRows);

    ATy(work, aty, work->buffer);

    cupdlp_twoNormSquared(work, lp->nCols, aty->data, lambda);

    cupdlp_float alpha = -(*lambda);
    cupdlp_axpy(work, lp->nRows, &alpha, q, ax->data);

    cupdlp_twoNormSquared(work, lp->nCols, ax->data, &res);

     if (work->settings->nLogLevel>0) 
      cupdlp_printf("% d  %e  %.3f\n", iter, *lambda, res);
  }

exit_cleanup:
  return retcode;
}